

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.cpp
# Opt level: O1

void license::generatePk(string *private_include,string *public_include)

{
  _Alloc_hider _Var1;
  ostream *poVar2;
  size_t sVar3;
  unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_> cryptoHlpr;
  string pubKey;
  long *local_40;
  string local_38;
  
  CryptoHelper::getInstance();
  (**(code **)*local_40)();
  (**(code **)(*local_40 + 0x10))(&local_38);
  write_pubkey_file(public_include,&local_38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"PublicKey",9);
  _Var1._M_p = local_38._M_dataplus._M_p;
  if (local_38._M_dataplus._M_p == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  }
  else {
    sVar3 = strlen(local_38._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,_Var1._M_p,sVar3);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  (**(code **)(*local_40 + 8))(&local_38);
  write_privkey_file(private_include,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  if (local_40 != (long *)0x0) {
    (**(code **)(*local_40 + 0x28))();
  }
  return;
}

Assistant:

void generatePk(string private_include, string public_include) {
	unique_ptr<CryptoHelper> cryptoHlpr = CryptoHelper::getInstance();

	try {
		cryptoHlpr->generateKeyPair();
	} catch (exception &e) {
		cerr << endl << "Error generating key pair: " << e.what() << endl
				<< "aborting" << endl;
		exit(2);
	}

	try {
		const string pubKey = cryptoHlpr->exportPublicKey();
		write_pubkey_file(public_include, pubKey);
		// Print out the public key to console as a
		// hexadecimal string.
		cout << endl << "PublicKey" << pubKey.c_str() << endl;
	} catch (exception &e) {
		cerr << endl << "Error exporting public key: " << e.what() << endl
				<< "aborting." << endl;
		exit(4);
	}

	try {
		const string privKey = cryptoHlpr->exportPrivateKey();
		write_privkey_file(private_include, privKey);
	} catch (exception &e) {
		cerr << endl << "Error exporting private key: " << e.what() << endl
				<< "aborting" << endl;
		exit(5);
	}

	return;
}